

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O1

void predict_or_learn_logistic<true>(boosting *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  pointer pfVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  float __x;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_50;
  
  fVar3 = ec->weight;
  iVar6 = o->t + 1;
  fVar8 = (float)iVar6;
  o->t = iVar6;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  local_50 = 0.0;
  if (0 < o->N) {
    __x = 0.0;
    local_50 = 0.0;
    lVar7 = 0;
    do {
      fVar9 = expf(__x);
      ec->weight = (1.0 / (fVar9 + 1.0)) * fVar3;
      iVar6 = (int)lVar7;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar6);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar6);
      fVar9 = (ec->pred).scalar;
      fVar10 = (ec->l).simple.label * fVar9;
      fVar4 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      __x = fVar10 * fVar4 + __x;
      fVar11 = expf(__x);
      pfVar5 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar5[lVar7] = ((4.0 / fVar8) * fVar10) / (fVar11 + 1.0) + pfVar5[lVar7];
      pfVar5 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (2.0 < pfVar5[lVar7]) {
        pfVar5[lVar7] = 2.0;
      }
      pfVar5 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2 = pfVar5 + lVar7;
      if (*pfVar2 <= -2.0 && *pfVar2 != -2.0) {
        pfVar5[lVar7] = -2.0;
      }
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar6);
      local_50 = local_50 + fVar9 * fVar4;
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * iVar6);
      lVar7 = lVar7 + 1;
    } while (lVar7 < o->N);
  }
  ec->weight = fVar3;
  ec->partial_prediction = local_50;
  fVar8 = *(float *)(&DAT_0028dab0 + (ulong)(0.0 < local_50) * 4);
  (ec->pred).scalar = fVar8;
  ec->loss = (float)(~-(uint)(fVar8 == (ec->l).simple.label) & (uint)fVar3);
  return;
}

Assistant:

void predict_or_learn_logistic(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / sqrtf((float)o.t);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;
      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      // if ld.label * ec.pred.scalar < 0, learner i made a mistake

      final_prediction += ec.pred.scalar * o.alpha[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar * o.alpha[i];
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}